

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TablePrinter * Catch::operator<<(TablePrinter *param_1)

{
  int iVar1;
  size_type sVar2;
  ostringstream *poVar3;
  size_type sVar4;
  long lVar5;
  ostream *poVar6;
  int __oflag;
  string *__file;
  string padding;
  value_type colInfo;
  size_type strSize;
  __string_type colStr;
  ColumnInfo *in_stack_fffffffffffffeb8;
  ColumnInfo *in_stack_fffffffffffffec0;
  TablePrinter *pTVar7;
  allocator local_d1;
  string local_d0 [64];
  int local_90;
  int local_8c;
  allocator local_71;
  string local_70 [32];
  StringRef local_50;
  size_type local_38;
  string local_30 [32];
  TablePrinter *local_10;
  
  local_10 = param_1;
  std::__cxx11::ostringstream::str();
  StringRef::StringRef((StringRef *)in_stack_fffffffffffffec0,&in_stack_fffffffffffffeb8->name);
  sVar2 = StringRef::numberOfCharacters(&local_50);
  StringRef::~StringRef((StringRef *)in_stack_fffffffffffffec0);
  poVar3 = &local_10->m_oss;
  local_38 = sVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",&local_71);
  __file = local_70;
  std::__cxx11::ostringstream::str((string *)poVar3);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  TablePrinter::open(local_10,(char *)__file,__oflag);
  iVar1 = local_10->m_currentColumn;
  sVar4 = clara::std::
          vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
          ::size(&local_10->m_columnInfos);
  if (iVar1 == (int)sVar4 + -1) {
    local_10->m_currentColumn = -1;
    std::operator<<(local_10->m_os,"\n");
  }
  local_10->m_currentColumn = local_10->m_currentColumn + 1;
  clara::std::
  vector<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
  ::operator[](&local_10->m_columnInfos,(long)local_10->m_currentColumn);
  anon_unknown_1::ColumnInfo::ColumnInfo(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (local_38 + 2 < (ulong)(long)local_90) {
    lVar5 = (long)local_90 - local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,lVar5 - 2,' ',&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  else {
    std::__cxx11::string::string(local_d0);
  }
  if (local_8c == 0) {
    poVar6 = std::operator<<(local_10->m_os,local_30);
    poVar6 = std::operator<<(poVar6,local_d0);
    std::operator<<(poVar6," ");
  }
  else {
    poVar6 = std::operator<<(local_10->m_os,local_d0);
    poVar6 = std::operator<<(poVar6,local_30);
    std::operator<<(poVar6," ");
  }
  pTVar7 = local_10;
  std::__cxx11::string::~string(local_d0);
  anon_unknown_1::ColumnInfo::~ColumnInfo((ColumnInfo *)0x13574d);
  std::__cxx11::string::~string(local_30);
  return pTVar7;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, ColumnBreak) {
        auto colStr = tp.m_oss.str();
        // This takes account of utf8 encodings
        auto strSize = Catch::StringRef(colStr).numberOfCharacters();
        tp.m_oss.str("");
        tp.open();
        if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
            tp.m_currentColumn = -1;
            tp.m_os << "\n";
        }
        tp.m_currentColumn++;

        auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
        auto padding = (strSize + 2 < static_cast<std::size_t>(colInfo.width))
            ? std::string(colInfo.width - (strSize + 2), ' ')
            : std::string();
        if (colInfo.justification == ColumnInfo::Left)
            tp.m_os << colStr << padding << " ";
        else
            tp.m_os << padding << colStr << " ";
        return tp;
    }